

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 target,U32 mls,int extDict)

{
  U32 UVar1;
  U32 *pUVar2;
  size_t sVar3;
  U32 local_130;
  uint local_12c;
  BYTE *local_128;
  uint local_11c;
  uint local_10c;
  BYTE *pBStack_108;
  U32 positions;
  size_t matchLength;
  U32 *nextPtr;
  BYTE *pBStack_f0;
  U32 nbCompares;
  size_t bestLength;
  U32 matchEndIdx;
  U32 windowLow;
  U32 dummy32;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 btLow;
  U32 curr;
  BYTE *match;
  BYTE *prefixStart;
  BYTE *dictEnd;
  long lStack_a0;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  uint local_78;
  U32 matchIndex;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t h;
  U32 *pUStack_58;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 local_40;
  int extDict_local;
  U32 mls_local;
  U32 target_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  BYTE *local_18;
  U32 *local_10;
  
  hashTable = &(ms->cParams).windowLog;
  pUStack_58 = ms->hashTable;
  h._4_4_ = (ms->cParams).hashLog;
  cParams._4_4_ = extDict;
  local_40 = mls;
  extDict_local = target;
  _mls_local = iend;
  iend_local = ip;
  ip_local = (BYTE *)ms;
  ms_local._0_4_ = mls;
  ms_local._4_4_ = h._4_4_;
  local_18 = ip;
  if (0x20 < h._4_4_) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(mls) {
  default:
    local_10 = (U32 *)ZSTD_hash4Ptr(ip,h._4_4_);
    break;
  case 5:
    local_10 = (U32 *)ZSTD_hash5Ptr(ip,h._4_4_);
    break;
  case 6:
    local_10 = (U32 *)ZSTD_hash6Ptr(ip,h._4_4_);
    break;
  case 7:
    local_10 = (U32 *)ZSTD_hash7Ptr(ip,h._4_4_);
    break;
  case 8:
    local_10 = (U32 *)ZSTD_hash8Ptr(ip,h._4_4_);
  }
  bt = local_10;
  _btMask = *(long *)(ip_local + 0x80);
  matchIndex = hashTable[1] - 1;
  local_78 = (1 << ((byte)matchIndex & 0x1f)) - 1;
  commonLengthSmaller._4_4_ = pUStack_58[(long)local_10];
  commonLengthLarger = 0;
  base = (BYTE *)0x0;
  dictBase = *(BYTE **)(ip_local + 8);
  lStack_a0 = *(long *)(ip_local + 0x10);
  dictEnd._4_4_ = *(uint *)(ip_local + 0x18);
  prefixStart = (BYTE *)(lStack_a0 + (ulong)dictEnd._4_4_);
  match = dictBase + dictEnd._4_4_;
  smallerPtr._4_4_ = (int)iend_local - (int)dictBase;
  if (local_78 < smallerPtr._4_4_) {
    local_11c = smallerPtr._4_4_ - local_78;
  }
  else {
    local_11c = 0;
  }
  smallerPtr._0_4_ = local_11c;
  largerPtr = (U32 *)(_btMask + (ulong)((smallerPtr._4_4_ & local_78) << 1) * 4);
  _windowLow = largerPtr + 1;
  UVar1 = ZSTD_getLowestMatchIndex((ZSTD_matchState_t *)ip_local,extDict_local,*hashTable);
  bestLength._4_4_ = smallerPtr._4_4_ + 9;
  pBStack_f0 = (BYTE *)0x8;
  nextPtr._4_4_ = 1 << ((byte)hashTable[3] & 0x1f);
  if ((uint)extDict_local < smallerPtr._4_4_) {
    __assert_fail("curr <= target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1dc,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  if (_mls_local + -8 < iend_local) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1dd,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  pUStack_58[(long)bt] = smallerPtr._4_4_;
  if (UVar1 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1e0,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  do {
    if (nextPtr._4_4_ == 0 || commonLengthSmaller._4_4_ < UVar1) {
LAB_003ea75e:
      *_windowLow = 0;
      *largerPtr = 0;
      local_10c = 0;
      if ((BYTE *)0x180 < pBStack_f0) {
        if ((int)pBStack_f0 - 0x180U < 0xc1) {
          local_12c = (int)pBStack_f0 - 0x180;
        }
        else {
          local_12c = 0xc0;
        }
        local_10c = local_12c;
      }
      if (smallerPtr._4_4_ + 8 < bestLength._4_4_) {
        if (bestLength._4_4_ - (smallerPtr._4_4_ + 8) < local_10c) {
          local_130 = local_10c;
        }
        else {
          local_130 = bestLength._4_4_ - (smallerPtr._4_4_ + 8);
        }
        return local_130;
      }
      __assert_fail("matchEndIdx > curr + 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x223,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    pUVar2 = (U32 *)(_btMask + (ulong)((commonLengthSmaller._4_4_ & local_78) << 1) * 4);
    if (commonLengthLarger < base) {
      local_128 = (BYTE *)commonLengthLarger;
    }
    else {
      local_128 = base;
    }
    if (smallerPtr._4_4_ <= commonLengthSmaller._4_4_) {
      __assert_fail("matchIndex < curr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x1e4,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    if ((cParams._4_4_ == 0) ||
       ((BYTE *)(ulong)dictEnd._4_4_ <= local_128 + commonLengthSmaller._4_4_)) {
      if (local_128 + commonLengthSmaller._4_4_ < (BYTE *)(ulong)dictEnd._4_4_) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x1fc,
                      "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                     );
      }
      _btLow = dictBase + commonLengthSmaller._4_4_;
      sVar3 = ZSTD_count(iend_local + (long)local_128,_btLow + (long)local_128,_mls_local);
      pBStack_108 = local_128 + sVar3;
    }
    else {
      _btLow = (BYTE *)(lStack_a0 + (ulong)commonLengthSmaller._4_4_);
      sVar3 = ZSTD_count_2segments
                        (iend_local + (long)local_128,_btLow + (long)local_128,_mls_local,
                         prefixStart,match);
      pBStack_108 = local_128 + sVar3;
      if ((BYTE *)(ulong)dictEnd._4_4_ <= pBStack_108 + commonLengthSmaller._4_4_) {
        _btLow = dictBase + commonLengthSmaller._4_4_;
      }
    }
    if ((pBStack_f0 < pBStack_108) &&
       (pBStack_f0 = pBStack_108,
       (BYTE *)(ulong)(bestLength._4_4_ - commonLengthSmaller._4_4_) < pBStack_108)) {
      bestLength._4_4_ = commonLengthSmaller._4_4_ + (int)pBStack_108;
    }
    if (iend_local + (long)pBStack_108 == _mls_local) goto LAB_003ea75e;
    if (_btLow[(long)pBStack_108] < iend_local[(long)pBStack_108]) {
      *largerPtr = commonLengthSmaller._4_4_;
      commonLengthLarger = (size_t)pBStack_108;
      if (commonLengthSmaller._4_4_ <= (uint)smallerPtr) {
        largerPtr = &matchEndIdx;
        goto LAB_003ea75e;
      }
      largerPtr = pUVar2 + 1;
      commonLengthSmaller._4_4_ = pUVar2[1];
    }
    else {
      *_windowLow = commonLengthSmaller._4_4_;
      base = pBStack_108;
      if (commonLengthSmaller._4_4_ <= (uint)smallerPtr) {
        _windowLow = &matchEndIdx;
        goto LAB_003ea75e;
      }
      commonLengthSmaller._4_4_ = *pUVar2;
      _windowLow = pUVar2;
    }
    nextPtr._4_4_ = nextPtr._4_4_ + -1;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                const ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const target,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    /* windowLow is based on target because
     * we only need positions that will be in the window at the end of the tree update.
     */
    U32 const windowLow = ZSTD_getLowestMatchIndex(ms, target, cParams->windowLog);
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(curr <= target);
    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    for (; nbCompares && (matchIndex >= windowLow); --nbCompares) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}